

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

void __thiscall TextFile::bufFillRead(TextFile *this)

{
  long lVar1;
  TextFile *this_local;
  
  if (this->mode == Read) {
    std::__cxx11::string::resize((ulong)&this->buf);
    lVar1 = std::__cxx11::string::operator[]((ulong)&this->buf);
    std::istream::read((char *)this,lVar1);
    std::istream::gcount();
    std::__cxx11::string::resize((ulong)&this->buf);
    this->bufPos = 0;
    return;
  }
  __assert_fail("mode == Read",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Util/FileClasses.cpp"
                ,0x319,"void TextFile::bufFillRead()");
}

Assistant:

void TextFile::bufFillRead()
{
	assert(mode == Read);

	buf.resize(TEXTFILE_BUF_MAX_SIZE);
	stream.read(&buf[0], TEXTFILE_BUF_MAX_SIZE);
	buf.resize(stream.gcount());
	bufPos = 0;
}